

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<true,_true,_true>::delete_block_link_
          (DaTrie<true,_true,_true> *this,uint32_t block_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint uVar1;
  uint uVar2;
  pointer pBVar3;
  ulong uVar4;
  
  uVar4 = (ulong)block_pos;
  pBVar3 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pBVar3 >> 4) <= uVar4) {
    __assert_fail("block_pos < blocks.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x4f6,
                  "void ddd::DaTrie<true, true, true>::delete_block_link_(uint32_t, std::vector<BlockLink> &) [WithBLM = true, WithNLM = true, Prefix = true]"
                 );
  }
  uVar1 = pBVar3[uVar4].next;
  if (uVar1 == block_pos) {
    this->head_pos_ = 0xffffffff;
    return;
  }
  if (this->head_pos_ == block_pos) {
    this->head_pos_ = uVar1;
  }
  uVar2 = pBVar3[uVar4].prev;
  pBVar3[uVar2].next = uVar1;
  pBVar3[uVar1].prev = uVar2;
  return;
}

Assistant:

void delete_block_link_(uint32_t block_pos, std::vector<BlockLink>& blocks) {
    assert(block_pos < blocks.size());

    if (blocks[block_pos].next == block_pos) {
      head_pos_ = NOT_FOUND;
      return;
    }

    if (block_pos == head_pos_) {
      head_pos_ = blocks[block_pos].next;
    }

    auto prev = blocks[block_pos].prev;
    auto next = blocks[block_pos].next;
    blocks[prev].next = next;
    blocks[next].prev = prev;
  }